

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlatformUtility.cpp
# Opt level: O1

int llbuild::basic::sys::raiseOpenFileLimit(llbuild_rlim_t limit)

{
  int iVar1;
  rlimit rl;
  rlimit local_18;
  
  iVar1 = getrlimit(RLIMIT_NOFILE,&local_18);
  if ((iVar1 == 0) && (iVar1 = 0, local_18.rlim_cur < limit)) {
    if (local_18.rlim_max < limit) {
      limit = local_18.rlim_max;
    }
    local_18.rlim_cur = limit;
    iVar1 = setrlimit(RLIMIT_NOFILE,&local_18);
  }
  return iVar1;
}

Assistant:

int sys::raiseOpenFileLimit(llbuild_rlim_t limit) {
#if defined(_WIN32)
  int curLimit = _getmaxstdio();
  if (curLimit >= limit) {
    return 0;
  }
  // 2048 is the hard upper limit on Windows
  return _setmaxstdio(std::min(limit, 2048)) == -1 ? -1 : 0;
#else
  int ret = 0;

  struct rlimit rl;
  ret = getrlimit(RLIMIT_NOFILE, &rl);
  if (ret != 0) {
    return ret;
  }

  if (rl.rlim_cur >= limit) {
    return 0;
  }

  rl.rlim_cur = std::min(limit, rl.rlim_max);

  return setrlimit(RLIMIT_NOFILE, &rl);
#endif
}